

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_gpio_set_pud(uint8_t pin,uint8_t pud)

{
  uint32_t uVar1;
  uint32_t *paddr_00;
  sbyte sVar2;
  uint32_t *paddr;
  uint32_t pull;
  uint32_t bits;
  int shiftbits;
  uint8_t pud_local;
  uint8_t pin_local;
  
  if (pud_type_rpi4 == '\0') {
    bcm2835_gpio_pud(pud);
    bcm2835_delayMicroseconds(10);
    bcm2835_gpio_pudclk(pin,'\x01');
    bcm2835_delayMicroseconds(10);
    bcm2835_gpio_pud('\0');
    bcm2835_gpio_pudclk(pin,'\0');
  }
  else {
    sVar2 = (pin & 0xf) * '\x02';
    if (pud == '\0') {
      paddr._0_4_ = 0;
    }
    else if (pud == '\x01') {
      paddr._0_4_ = 2;
    }
    else {
      if (pud != '\x02') {
        return;
      }
      paddr._0_4_ = 1;
    }
    paddr_00 = bcm2835_gpio + (long)((int)(uint)pin >> 4) + 0x39;
    uVar1 = bcm2835_peri_read_nb(paddr_00);
    bcm2835_peri_write_nb(paddr_00,(int)paddr << sVar2 | (3 << sVar2 ^ 0xffffffffU) & uVar1);
  }
  return;
}

Assistant:

void bcm2835_gpio_set_pud(uint8_t pin, uint8_t pud)
{
    if( pud_type_rpi4 )
    {
        int shiftbits = (pin & 0xf) << 1;
        uint32_t bits;
        uint32_t pull;
        
        switch (pud)
        {
           case BCM2835_GPIO_PUD_OFF:  pull = 0; break;
           case BCM2835_GPIO_PUD_UP:   pull = 1; break;
           case BCM2835_GPIO_PUD_DOWN: pull = 2; break;
           default: return;
        }
                
        volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPPUPPDN0/4 + (pin >> 4);
        
        bits = bcm2835_peri_read_nb( paddr );
        bits &= ~(3 << shiftbits);
        bits |= (pull << shiftbits);
        
        bcm2835_peri_write_nb( paddr, bits );
        
    } else
    {
    bcm2835_gpio_pud(pud);
    delayMicroseconds(10);
    bcm2835_gpio_pudclk(pin, 1);
    delayMicroseconds(10);
    bcm2835_gpio_pud(BCM2835_GPIO_PUD_OFF);
    bcm2835_gpio_pudclk(pin, 0);
}

}